

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem.hpp
# Opt level: O3

problem_solver_type __thiscall baryonyx::problem::which_problem_type(problem *this)

{
  int iVar1;
  problem_solver_type pVar2;
  
  iVar1 = coefficient_type(this);
  if (((this->greater_constraints).
       super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>._M_impl.
       super__Vector_impl_data._M_start ==
       (this->greater_constraints).
       super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>._M_impl.
       super__Vector_impl_data._M_finish) &&
     ((this->less_constraints).
      super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (this->less_constraints).
      super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>._M_impl.
      super__Vector_impl_data._M_finish)) {
    pVar2 = (iVar1 != 1) + equalities_101;
    if (iVar1 == 0) {
      pVar2 = equalities_01;
    }
  }
  else {
    pVar2 = inequalities_01;
    if (iVar1 != 0) {
      pVar2 = iVar1 == 1 ^ inequalities_Z;
    }
  }
  return pVar2;
}

Assistant:

problem_solver_type which_problem_type() noexcept
    {
        auto coefficient = coefficient_type();

        if (greater_constraints.empty() && less_constraints.empty()) {
            switch (coefficient) {
            case 0:
                return problem_solver_type::equalities_01;
            case 1:
                return problem_solver_type::equalities_101;
            default:
                return problem_solver_type::equalities_Z;
            }
        } else {
            switch (coefficient) {
            case 0:
                return problem_solver_type::inequalities_01;
            case 1:
                return problem_solver_type::inequalities_101;
            default:
                return problem_solver_type::inequalities_Z;
            }
        }

        return problem_solver_type::inequalities_Z;
    }